

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  
  concept_suite::run();
  iterator_traits_suite::run();
  begin_suite::run();
  pre_increment_suite::run();
  post_increment_suite::run();
  pre_decrement_suite::run();
  post_decrement_suite::run();
  dereference_suite::run();
  distance_suite::run();
  range_for_suite::run();
  reverse_iterator_suite::run();
  key_iterator_suite::run();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    concept_suite::run();
    iterator_traits_suite::run();
    begin_suite::run();
    pre_increment_suite::run();
    post_increment_suite::run();
    pre_decrement_suite::run();
    post_decrement_suite::run();
    dereference_suite::run();
    distance_suite::run();
    range_for_suite::run();
    reverse_iterator_suite::run();
    key_iterator_suite::run();

    return boost::report_errors();
}